

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::create_color_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  int *piVar1;
  ushort uVar2;
  color_cluster *pcVar3;
  uint uVar4;
  ulong uVar5;
  uint (*pauVar6) [16];
  uint (*pauVar7) [256];
  uint p_1;
  ulong uVar8;
  color_quad_u8 *e2;
  uint uVar9;
  long lVar10;
  uint p;
  ulong uVar11;
  uint (*pauVar12) [4];
  uint uVar13;
  ulong uVar14;
  uint s_4;
  long lVar15;
  uint uVar16;
  uint s;
  long lVar17;
  uint local_1358;
  uint E2 [16] [4];
  uint E4 [8] [16];
  uint E8 [4] [256];
  
  uVar8 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  uVar14 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  uVar5 = (uVar8 * data) / uVar14;
  while( true ) {
    pauVar12 = E2;
    local_1358 = (uint)(((data + 1) * uVar8) / uVar14);
    uVar9 = (uint)uVar5;
    if (local_1358 <= uVar9) break;
    pcVar3 = (this->m_color_clusters).m_p;
    uVar2 = (this->m_endpoint_indices).m_p[uVar5 & 0xffffffff].field_0.field_0.color;
    for (uVar11 = 0; uVar11 != 0x10; uVar11 = uVar11 + 1) {
      lVar17 = 0;
      for (lVar10 = 0x48; lVar10 != 0x58; lVar10 = lVar10 + 4) {
        if (this->m_has_subblocks == true) {
          e2 = (color_quad_u8 *)
               ((long)&(this->m_color_clusters).m_p
                       [(this->m_endpoint_indices).m_p[(uint)(uVar11 >> 3) & 0x1fffffff | uVar9 * 2]
                        .field_0.field_0.color].blocks[0].m_p + lVar10);
        }
        else {
          e2 = pcVar3[uVar2].color_values + lVar17;
        }
        uVar4 = crnlib::color::color_distance
                          ((this->m_params).m_perceptual,this->m_blocks[uVar5 & 0xffffffff] + uVar11
                           ,e2,false);
        *(uint *)((long)pauVar12[-5] + lVar10 + 8) = uVar4;
        lVar17 = lVar17 + 1;
      }
      pauVar12 = pauVar12 + 1;
    }
    pauVar6 = E4;
    pauVar12 = E2;
    for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
        (*pauVar6)[lVar17] =
             *(int *)((long)E2[lVar10 * 2 + 1] + (ulong)((uint)lVar17 & 0xfffffffc)) +
             E2[lVar10 * 2][(uint)lVar17 & 3];
      }
      pauVar6 = pauVar6 + 1;
    }
    pauVar7 = E8;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
        (*pauVar7)[uVar5] =
             E4[lVar10 * 2 + 1][uVar5 >> 4 & 0xfffffff] + E4[lVar10 * 2][(uint)uVar5 & 0xf];
      }
      pauVar7 = pauVar7 + 1;
    }
    uVar5 = 0;
    uVar13 = 0xffffffff;
    for (uVar11 = 0; (this->m_color_selectors).m_size != uVar11; uVar11 = uVar11 + 1) {
      uVar16 = (this->m_color_selectors).m_p[uVar11];
      uVar16 = E8[1][uVar16 >> 8 & 0xff] + E8[0][uVar16 & 0xff] +
               *(int *)((long)E8[2] + (ulong)(uVar16 >> 0xe & 0x3fc)) + E8[3][uVar16 >> 0x18];
      if (uVar16 < uVar13) {
        uVar5 = uVar11 & 0xffffffff;
        uVar13 = uVar16;
      }
    }
    lVar10 = *pData_ptr + uVar5 * 0x104;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
        piVar1 = (int *)(lVar10 + lVar15 * 4);
        *piVar1 = *piVar1 + (*pauVar12)[lVar15];
      }
      pauVar12 = pauVar12 + 1;
      lVar10 = lVar10 + 0x10;
    }
    *(undefined1 *)(*pData_ptr + 0x100 + uVar5 * 0x104) = 1;
    (this->m_selector_indices).m_p[uVar9 << (this->m_has_subblocks & 0x1fU)].field_0.field_0.color =
         (uint16)uVar5;
    uVar5 = (ulong)(uVar9 + 1);
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook_task(uint64 data, void* pData_ptr) {
  crnlib::vector<color_selector_details>& selector_details = *static_cast<crnlib::vector<color_selector_details>*>(pData_ptr);
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint E2[16][4];
  uint E4[8][16];
  uint E8[4][256];
  for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++) {
    color_cluster& cluster = m_color_clusters[m_endpoint_indices[b].color];
    color_quad_u8* endpoint_colors = cluster.color_values;
    for (uint p = 0; p < 16; p++) {
      for (uint s = 0; s < 4; s++)
        E2[p][s] = m_has_subblocks ? color::color_distance(m_params.m_perceptual, m_blocks[b][p], m_color_clusters[m_endpoint_indices[b << 1 | p >> 3].color].color_values[s], false) :
          color::color_distance(m_params.m_perceptual, m_blocks[b][p], endpoint_colors[s], false);
    }
    for (uint p = 0; p < 8; p++) {
      for (uint s = 0; s < 16; s++)
        E4[p][s] = E2[p << 1][s & 3] + E2[p << 1 | 1][s >> 2];
    }
    for (uint p = 0; p < 4; p++) {
      for (uint s = 0; s < 256; s++)
        E8[p][s] = E4[p << 1][s & 15] + E4[p << 1 | 1][s >> 4];
    }
    uint best_index = 0;
    for (uint best_error = cUINT32_MAX, s = 0; s < m_color_selectors.size(); s++) {
      uint32 selector = m_color_selectors[s];
      uint error = E8[0][selector & 255] + E8[1][selector >> 8 & 255] + E8[2][selector >> 16 & 255] + E8[3][selector >> 24 & 255];
      if (error < best_error) {
        best_error = error;
        best_index = s;
      }
    }
    uint (&total_errors)[16][4] = selector_details[best_index].error;
    for (uint p = 0; p < 16; p++) {
      for (uint s = 0; s < 4; s++)
        total_errors[p][s] += E2[p][s];
    }
    selector_details[best_index].used = true;
    m_selector_indices[m_has_subblocks ? b << 1 : b].color = best_index;
  }
}